

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week4-app2.cpp
# Opt level: O1

void __thiscall Vector<int>::operator=(Vector<int> *this,Vector<int> *other)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  
  if (this->N != other->N) {
    if (this->values != (int *)0x0) {
      operator_delete__(this->values);
    }
    iVar1 = other->N;
    uVar5 = 0xffffffffffffffff;
    if (-1 < (long)iVar1) {
      uVar5 = (long)iVar1 * 4;
    }
    piVar3 = (int *)operator_new__(uVar5);
    this->values = piVar3;
    this->N = iVar1;
  }
  if (0 < this->N) {
    piVar3 = other->values;
    piVar2 = this->values;
    lVar4 = 0;
    do {
      piVar2[lVar4] = piVar3[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->N);
  }
  return;
}

Assistant:

void operator=(const Vector& other)
    {
        if(N != other.N)
        {
            delete[](values);
            values = new T[other.N];
            N = other.N;
        }
        for(int i=0; i<N; ++i)
            values[i] = other.values[i];
    }